

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp3(Vdbe *p,int op,int p1,int p2,int p3)

{
  int iVar1;
  Op *pOVar2;
  VdbeOp *pOp;
  int i;
  int p3_local;
  int p2_local;
  int p1_local;
  int op_local;
  Vdbe *p_local;
  
  p_local._4_4_ = p->nOp;
  if ((p_local._4_4_ < p->nOpAlloc) || (iVar1 = growOpArray(p), iVar1 == 0)) {
    p->nOp = p->nOp + 1;
    pOVar2 = p->aOp + p_local._4_4_;
    pOVar2->opcode = (u8)op;
    pOVar2->p5 = '\0';
    pOVar2->p1 = p1;
    pOVar2->p2 = p2;
    pOVar2->p3 = p3;
    (pOVar2->p4).p = (void *)0x0;
    pOVar2->p4type = '\0';
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp3(Vdbe *p, int op, int p1, int p2, int p3){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( op>0 && op<0xff );
  if( p->nOpAlloc<=i ){
    if( growOpArray(p) ){
      return 1;
    }
  }
  p->nOp++;
  pOp = &p->aOp[i];
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.p = 0;
  pOp->p4type = P4_NOTUSED;
#ifdef SQLITE_DEBUG
  pOp->zComment = 0;
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
  }
#endif
#ifdef VDBE_PROFILE
  pOp->cycles = 0;
  pOp->cnt = 0;
#endif
  return i;
}